

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainIndexRange(StrAccum *pStr,WhereLoop *pLoop)

{
  ushort uVar1;
  ushort uVar2;
  Index *pIdx;
  int iTerm;
  char *pcVar3;
  char *zFormat;
  char *z;
  int local_28;
  int j;
  int i;
  u16 nSkip;
  u16 nEq;
  Index *pIndex;
  WhereLoop *pLoop_local;
  StrAccum *pStr_local;
  
  pIdx = (pLoop->u).btree.pIndex;
  uVar1 = (pLoop->u).btree.nEq;
  uVar2 = pLoop->nSkip;
  if ((uVar1 != 0) || ((pLoop->wsFlags & 0x30) != 0)) {
    sqlite3_str_append(pStr," (",2);
    for (local_28 = 0; iTerm = local_28, local_28 < (int)(uint)uVar1; local_28 = local_28 + 1) {
      pcVar3 = explainIndexColumnName(pIdx,local_28);
      if (local_28 != 0) {
        sqlite3_str_append(pStr," AND ",5);
      }
      zFormat = "ANY(%s)";
      if ((int)(uint)uVar2 <= local_28) {
        zFormat = "%s=?";
      }
      sqlite3_str_appendf(pStr,zFormat,pcVar3);
    }
    if ((pLoop->wsFlags & 0x20) != 0) {
      explainAppendTerm(pStr,pIdx,(uint)(pLoop->u).btree.nBtm,local_28,local_28,">");
      local_28 = 1;
    }
    if ((pLoop->wsFlags & 0x10) != 0) {
      explainAppendTerm(pStr,pIdx,(uint)(pLoop->u).btree.nTop,iTerm,local_28,"<");
    }
    sqlite3_str_append(pStr,")",1);
  }
  return;
}

Assistant:

static void explainIndexRange(StrAccum *pStr, WhereLoop *pLoop){
  Index *pIndex = pLoop->u.btree.pIndex;
  u16 nEq = pLoop->u.btree.nEq;
  u16 nSkip = pLoop->nSkip;
  int i, j;

  if( nEq==0 && (pLoop->wsFlags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))==0 ) return;
  sqlite3_str_append(pStr, " (", 2);
  for(i=0; i<nEq; i++){
    const char *z = explainIndexColumnName(pIndex, i);
    if( i ) sqlite3_str_append(pStr, " AND ", 5);
    sqlite3_str_appendf(pStr, i>=nSkip ? "%s=?" : "ANY(%s)", z);
  }

  j = i;
  if( pLoop->wsFlags&WHERE_BTM_LIMIT ){
    explainAppendTerm(pStr, pIndex, pLoop->u.btree.nBtm, j, i, ">");
    i = 1;
  }
  if( pLoop->wsFlags&WHERE_TOP_LIMIT ){
    explainAppendTerm(pStr, pIndex, pLoop->u.btree.nTop, j, i, "<");
  }
  sqlite3_str_append(pStr, ")", 1);
}